

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

uint qpdf_oh_get_uint_value_as_uint(qpdf_data qpdf,qpdf_oh oh)

{
  uint uVar1;
  undefined4 local_4c;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._M_unused._M_object = &local_4c;
  local_4c = 0;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<unsigned_int_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:865:12)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<unsigned_int_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:865:12)>
             ::_M_manager;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<unsigned_int_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1223:75)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<unsigned_int_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1223:75)>
             ::_M_manager;
  uVar1 = do_with_oh<unsigned_int>
                    (qpdf,oh,(function<unsigned_int_()> *)&local_28,
                     (function<unsigned_int_(QPDFObjectHandle_&)> *)&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return uVar1;
}

Assistant:

unsigned int
qpdf_oh_get_uint_value_as_uint(qpdf_data qpdf, qpdf_oh oh)
{
    return do_with_oh<unsigned int>(qpdf, oh, return_T<unsigned int>(0U), [](QPDFObjectHandle& o) {
        QTC::TC("qpdf", "qpdf-c called qpdf_oh_get_uint_value_as_uint");
        return o.getUIntValueAsUInt();
    });
}